

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemAloha.cpp
# Opt level: O0

string * __thiscall
ProblemAloha::transmissionStatusToString_abi_cxx11_(ProblemAloha *this,Index status)

{
  int in_EDX;
  string *in_RDI;
  string *str;
  
  std::__cxx11::string::string((string *)in_RDI);
  if (in_EDX == 0) {
    std::__cxx11::string::operator=((string *)in_RDI,"Succ");
  }
  else if (in_EDX == 1) {
    std::__cxx11::string::operator=((string *)in_RDI,"Idle");
  }
  else if (in_EDX == 2) {
    std::__cxx11::string::operator=((string *)in_RDI,"Coll");
  }
  return in_RDI;
}

Assistant:

string ProblemAloha::transmissionStatusToString(Index status) const
{
    string str;
    switch(status){
    case(SUCCESS):
        str = "Succ";
        break;
    case(IDLEo):
        str = "Idle";
        break;
    case(COLLISION):
        str = "Coll";
        break;
    }
    return(str);
}